

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsPublication
helicsFederateRegisterPublication
          (HelicsFederate fed,char *key,HelicsDataTypes type,char *units,HelicsError *err)

{
  pointer pcVar1;
  size_type sVar2;
  string_view units_00;
  HelicsPublication pvVar3;
  string *psVar4;
  Publication *pPVar5;
  _Alloc_hider _Var6;
  string_view name;
  string_view type_00;
  __single_object pub;
  shared_ptr<helics::ValueFederate> fedObj;
  _Head_base<0UL,_helics::PublicationObject_*,_false> local_70;
  size_type local_68;
  __uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
  local_60;
  __shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2> local_58;
  ValueFederate *local_48;
  size_t local_40;
  char *pcStack_38;
  
  getValueFedSharedPtr(&local_58,(HelicsError *)fed);
  if (local_58._M_ptr != (ValueFederate *)0x0) {
    if (((uint)type < 10) || (type == HELICS_DATA_TYPE_JSON)) {
      std::make_unique<helics::PublicationObject>();
      local_48 = local_58._M_ptr;
      local_68 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var6 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (key != (char *)0x0) {
        local_68 = strlen(key);
        _Var6._M_p = key;
      }
      psVar4 = helics::typeNameStringRef_abi_cxx11_(type);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      sVar2 = psVar4->_M_string_length;
      local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      pcStack_38 = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (units != (char *)0x0) {
        local_40 = strlen(units);
        pcStack_38 = units;
      }
      units_00._M_str = pcStack_38;
      units_00._M_len = local_40;
      name._M_str = _Var6._M_p;
      name._M_len = local_68;
      type_00._M_str = pcVar1;
      type_00._M_len = sVar2;
      pPVar5 = helics::ValueFederate::registerPublication(local_48,name,type_00,units_00);
      (local_70._M_head_impl)->pubPtr = pPVar5;
      std::__shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_70._M_head_impl)->fedptr).
                  super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>,&local_58);
      local_60._M_t.
      super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
      .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl =
           (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
           (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
           local_70._M_head_impl;
      local_70._M_head_impl = (PublicationObject *)0x0;
      pvVar3 = anon_unknown.dwarf_694c0::addPublication
                         (fed,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                               *)&local_60);
      std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
      ~unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                   *)&local_60);
      std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
      ~unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                   *)&local_70);
      goto LAB_00182257;
    }
    if (type == HELICS_DATA_TYPE_RAW) {
      pvVar3 = helicsFederateRegisterTypePublication(fed,key,"raw",units,err);
      goto LAB_00182257;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "unrecognized type code";
    }
  }
  pvVar3 = (HelicsPublication)0x0;
LAB_00182257:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return pvVar3;
}

Assistant:

HelicsPublication
    helicsFederateRegisterPublication(HelicsFederate fed, const char* key, HelicsDataTypes type, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    if ((type < HELICS_DATA_TYPE_STRING) || (type > HELICS_DATA_TYPE_CHAR)) {
        if (type == HELICS_DATA_TYPE_RAW) {
            return helicsFederateRegisterTypePublication(fed, key, "raw", units, err);
        }
        if (type != HELICS_DATA_TYPE_JSON) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, unknownTypeCode);
            return nullptr;
        }
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &(fedObj->registerPublication(AS_STRING_VIEW(key),
                                                    helics::typeNameStringRef(static_cast<helics::DataType>(type)),
                                                    AS_STRING_VIEW(units)));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}